

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void FS_GiveInventory(AActor *actor,char *type,int amount)

{
  int iVar1;
  PClassActor *p;
  PClassInventory *type_00;
  char *name;
  
  if (amount < 1) {
    return;
  }
  iVar1 = strcmp(type,"Armor");
  name = "BasicArmorPickup";
  if (iVar1 != 0) {
    name = type;
  }
  p = PClass::FindActor(name);
  type_00 = dyn_cast<PClassInventory>((DObject *)p);
  if (type_00 != (PClassInventory *)0x0) {
    AActor::GiveInventory(actor,type_00,amount,false);
    return;
  }
  Printf("Unknown inventory item: %s\n",name);
  return;
}

Assistant:

static void FS_GiveInventory (AActor *actor, const char * type, int amount)
{
	if (amount <= 0)
	{
		return;
	}
	if (strcmp (type, "Armor") == 0)
	{
		type = "BasicArmorPickup";
	}
	PClassInventory * info = dyn_cast<PClassInventory>(PClass::FindActor (type));
	if (info == NULL)
	{
		Printf ("Unknown inventory item: %s\n", type);
		return;
	}

	actor->GiveInventory(info, amount);
}